

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O0

uint64_t Wyhash(void *data,size_t len,uint64_t seed,uint64_t *salt)

{
  uint32_t uVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  uint64_t uVar5;
  uint64_t uVar6;
  uint64_t uVar7;
  uint64_t uVar8;
  uint64_t uVar9;
  uint64_t z;
  uint64_t w;
  uint64_t b;
  uint64_t a;
  uint64_t b_2;
  uint64_t a_2;
  uint64_t ds1;
  uint64_t ds0;
  uint64_t cs1;
  uint64_t cs0;
  uint64_t h;
  uint64_t g;
  uint64_t f;
  uint64_t e;
  uint64_t d;
  uint64_t c;
  uint64_t b_1;
  uint64_t a_1;
  uint64_t duplicated_state;
  uint64_t current_state;
  uint64_t starting_length;
  uint8_t *ptr;
  uint64_t *salt_local;
  uint64_t seed_local;
  size_t len_local;
  void *data_local;
  
  a_1 = seed ^ *salt;
  duplicated_state = a_1;
  starting_length = (uint64_t)data;
  seed_local = len;
  if (0x40 < len) {
    do {
      uVar2 = UnalignedLoad64((void *)starting_length);
      uVar3 = UnalignedLoad64((void *)(starting_length + 8));
      uVar4 = UnalignedLoad64((void *)(starting_length + 0x10));
      uVar5 = UnalignedLoad64((void *)(starting_length + 0x18));
      uVar6 = UnalignedLoad64((void *)(starting_length + 0x20));
      uVar7 = UnalignedLoad64((void *)(starting_length + 0x28));
      uVar8 = UnalignedLoad64((void *)(starting_length + 0x30));
      uVar9 = UnalignedLoad64((void *)(starting_length + 0x38));
      uVar2 = WyhashMix(uVar2 ^ salt[1],uVar3 ^ duplicated_state);
      uVar3 = WyhashMix(uVar4 ^ salt[2],uVar5 ^ duplicated_state);
      duplicated_state = uVar2 ^ uVar3;
      uVar2 = WyhashMix(uVar6 ^ salt[3],uVar7 ^ a_1);
      uVar3 = WyhashMix(uVar8 ^ salt[4],uVar9 ^ a_1);
      a_1 = uVar2 ^ uVar3;
      starting_length = starting_length + 0x40;
      seed_local = seed_local - 0x40;
    } while (0x40 < seed_local);
    duplicated_state = duplicated_state ^ a_1;
  }
  for (; 0x10 < seed_local; seed_local = seed_local - 0x10) {
    uVar2 = UnalignedLoad64((void *)starting_length);
    uVar3 = UnalignedLoad64((void *)(starting_length + 8));
    duplicated_state = WyhashMix(uVar2 ^ salt[1],uVar3 ^ duplicated_state);
    starting_length = starting_length + 0x10;
  }
  if (seed_local < 9) {
    if (seed_local < 4) {
      if (seed_local == 0) {
        b = 0;
      }
      else {
        b = (uint64_t)
            (int)((uint)*(byte *)starting_length << 0x10 |
                  (uint)*(byte *)(starting_length + (seed_local >> 1)) << 8 |
                 (uint)*(byte *)(starting_length + (seed_local - 1)));
      }
      w = 0;
    }
    else {
      uVar1 = UnalignedLoad32((void *)starting_length);
      b = (uint64_t)uVar1;
      uVar1 = UnalignedLoad32((void *)(starting_length + seed_local + -4));
      w = (uint64_t)uVar1;
    }
  }
  else {
    b = UnalignedLoad64((void *)starting_length);
    w = UnalignedLoad64((void *)(starting_length + seed_local + -8));
  }
  uVar2 = WyhashMix(b ^ salt[1],w ^ duplicated_state);
  uVar2 = WyhashMix(uVar2,salt[1] ^ len);
  return uVar2;
}

Assistant:

static uint64_t Wyhash(const void* data, size_t len, uint64_t seed,
                       const uint64_t salt[]) {
  const uint8_t* ptr = (const uint8_t*)data;
  uint64_t starting_length = (uint64_t)len;
  uint64_t current_state = seed ^ salt[0];

  if (len > 64) {
    // If we have more than 64 bytes, we're going to handle chunks of 64
    // bytes at a time. We're going to build up two separate hash states
    // which we will then hash together.
    uint64_t duplicated_state = current_state;

    do {
      uint64_t a = UnalignedLoad64(ptr);
      uint64_t b = UnalignedLoad64(ptr + 8);
      uint64_t c = UnalignedLoad64(ptr + 16);
      uint64_t d = UnalignedLoad64(ptr + 24);
      uint64_t e = UnalignedLoad64(ptr + 32);
      uint64_t f = UnalignedLoad64(ptr + 40);
      uint64_t g = UnalignedLoad64(ptr + 48);
      uint64_t h = UnalignedLoad64(ptr + 56);

      uint64_t cs0 = WyhashMix(a ^ salt[1], b ^ current_state);
      uint64_t cs1 = WyhashMix(c ^ salt[2], d ^ current_state);
      current_state = (cs0 ^ cs1);

      uint64_t ds0 = WyhashMix(e ^ salt[3], f ^ duplicated_state);
      uint64_t ds1 = WyhashMix(g ^ salt[4], h ^ duplicated_state);
      duplicated_state = (ds0 ^ ds1);

      ptr += 64;
      len -= 64;
    } while (len > 64);

    current_state = current_state ^ duplicated_state;
  }

  // We now have a data `ptr` with at most 64 bytes and the current state
  // of the hashing state machine stored in current_state.
  while (len > 16) {
    uint64_t a = UnalignedLoad64(ptr);
    uint64_t b = UnalignedLoad64(ptr + 8);

    current_state = WyhashMix(a ^ salt[1], b ^ current_state);

    ptr += 16;
    len -= 16;
  }

  // We now have a data `ptr` with at most 16 bytes.
  uint64_t a = 0;
  uint64_t b = 0;
  if (len > 8) {
    // When we have at least 9 and at most 16 bytes, set A to the first 64
    // bits of the input and B to the last 64 bits of the input. Yes, they will
    // overlap in the middle if we are working with less than the full 16
    // bytes.
    a = UnalignedLoad64(ptr);
    b = UnalignedLoad64(ptr + len - 8);
  } else if (len > 3) {
    // If we have at least 4 and at most 8 bytes, set A to the first 32
    // bits and B to the last 32 bits.
    a = UnalignedLoad32(ptr);
    b = UnalignedLoad32(ptr + len - 4);
  } else if (len > 0) {
    // If we have at least 1 and at most 3 bytes, read all of the provided
    // bits into A, with some adjustments.
    a = ((ptr[0] << 16) | (ptr[len >> 1] << 8) | ptr[len - 1]);
    b = 0;
  } else {
    a = 0;
    b = 0;
  }

  uint64_t w = WyhashMix(a ^ salt[1], b ^ current_state);
  uint64_t z = salt[1] ^ starting_length;
  return WyhashMix(w, z);
}